

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

string * __thiscall
ctemplate::TemplateToken::ToString_abi_cxx11_(string *__return_storage_ptr__,TemplateToken *this)

{
  char *pcVar1;
  size_t sVar2;
  ModifierInfo *pMVar3;
  long *plVar4;
  long *plVar5;
  pointer pMVar6;
  long *local_78;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = this->text;
  local_58 = &__return_storage_ptr__->field_2;
  sVar2 = this->textlen;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  pMVar6 = (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar6 != (this->modvals).
                super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pMVar3 = pMVar6->modifier_info;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,":","");
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(pMVar3->long_name)._M_dataplus._M_p);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar4[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (pMVar6->modifier_info->is_registered == false) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != (this->modvals).
                       super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const {   // used for debugging (annotations)
    string retval(text, textlen);
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end();  ++it) {
      const string& modname = it->modifier_info->long_name;
      retval += string(":") + modname;
      if (!it->modifier_info->is_registered)
        retval += "<not registered>";
    }
    return retval;
  }